

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  Snapshot *this_00;
  pointer pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  PolicyID id;
  _Hash_node_base *p_Var8;
  pointer source;
  undefined1 auStack_378 [8];
  string orig;
  long *local_340;
  long local_338;
  long local_330 [2];
  string dirs;
  ios_base local_2b0 [264];
  ostringstream w;
  ios_base local_138 [264];
  
  this_00 = &this->StateSnapshot;
  PVar3 = cmState::Snapshot::GetPolicy(this_00,CMP0019);
  if (PVar3 < NEW) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    orig._M_dataplus._M_p = (pointer)&orig.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&orig,"INCLUDE_DIRECTORIES","");
    cmState::Snapshot::GetDirectory((Directory *)&dirs,this_00);
    pcVar5 = cmState::Directory::GetProperty((Directory *)&dirs,&orig);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)orig._M_dataplus._M_p != &orig.field_2) {
      operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
    }
    bVar2 = mightExpandVariablesCMP0019(pcVar5);
    if (bVar2) {
      std::__cxx11::string::string((string *)&dirs,pcVar5,(allocator *)&orig);
      ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar3 == WARN) && (iVar4 = std::__cxx11::string::compare((char *)&dirs), iVar4 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&w,"Evaluated directory INCLUDE_DIRECTORIES\n",0x28);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(_w + -0x18) + 0x1d0);
        }
        else {
          sVar6 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,pcVar5,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"as\n",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&w,dirs._M_dataplus._M_p,dirs._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      }
      orig._M_dataplus._M_p = (pointer)&orig.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&orig,"INCLUDE_DIRECTORIES","");
      SetProperty(this,&orig,dirs._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)orig._M_dataplus._M_p != &orig.field_2) {
        operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs._M_dataplus._M_p != &dirs.field_2) {
        operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
      }
    }
    p_Var8 = (this->Targets)._M_h._M_before_begin._M_nxt;
    if (p_Var8 != (_Hash_node_base *)0x0) {
      do {
        if (((ulong)p_Var8[0x4a]._M_nxt & 0xfffffffe) != 6) {
          dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&dirs,"INCLUDE_DIRECTORIES","");
          pcVar5 = cmTarget::GetProperty((cmTarget *)(p_Var8 + 5),&dirs);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirs._M_dataplus._M_p != &dirs.field_2) {
            operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
          }
          bVar2 = mightExpandVariablesCMP0019(pcVar5);
          if (bVar2) {
            std::__cxx11::string::string((string *)&dirs,pcVar5,(allocator *)&orig);
            ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
            if ((PVar3 == WARN) &&
               (iVar4 = std::__cxx11::string::compare((char *)&dirs), iVar4 != 0)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&w,"Evaluated target ",0x11);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&w,(char *)p_Var8[0x27]._M_nxt,
                                  (long)p_Var8[0x28]._M_nxt);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," INCLUDE_DIRECTORIES\n",0x15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
              if (pcVar5 == (char *)0x0) {
                std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
              }
              else {
                sVar6 = strlen(pcVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"as\n",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,dirs._M_dataplus._M_p,dirs._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            }
            orig._M_dataplus._M_p = (pointer)&orig.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&orig,"INCLUDE_DIRECTORIES","");
            cmTarget::SetProperty((cmTarget *)(p_Var8 + 5),&orig,dirs._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)orig._M_dataplus._M_p != &orig.field_2) {
              operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dirs._M_dataplus._M_p != &dirs.field_2) {
              operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
            }
          }
        }
        p_Var8 = p_Var8->_M_nxt;
      } while (p_Var8 != (_Hash_node_base *)0x0);
    }
    orig._M_dataplus._M_p = (pointer)&orig.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&orig,"LINK_DIRECTORIES","");
    cmState::Snapshot::GetDirectory((Directory *)&dirs,this_00);
    pcVar5 = cmState::Directory::GetProperty((Directory *)&dirs,&orig);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)orig._M_dataplus._M_p != &orig.field_2) {
      operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar5 != (char *)0x0) && (bVar2 = mightExpandVariablesCMP0019(pcVar5), bVar2)) {
      dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&dirs,pcVar5,pcVar5 + sVar6);
      orig._M_dataplus._M_p = (pointer)&orig.field_2;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&orig,pcVar5,pcVar5 + sVar6);
      ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar3 == WARN) &&
         ((dirs._M_string_length != orig._M_string_length ||
          ((dirs._M_string_length != 0 &&
           (iVar4 = bcmp(dirs._M_dataplus._M_p,orig._M_dataplus._M_p,dirs._M_string_length),
           iVar4 != 0)))))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&w,"Evaluated link directories\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&w,orig._M_dataplus._M_p,orig._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"as\n",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,dirs._M_dataplus._M_p,dirs._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)orig._M_dataplus._M_p != &orig.field_2) {
        operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs._M_dataplus._M_p != &dirs.field_2) {
        operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
      }
    }
    source = (this->LinkLibraries).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (source != (this->LinkLibraries).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar2 = mightExpandVariablesCMP0019((source->first)._M_dataplus._M_p);
        if (bVar2) {
          pcVar1 = (source->first)._M_dataplus._M_p;
          dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&dirs,pcVar1,pcVar1 + (source->first)._M_string_length);
          ExpandVariablesInString(this,&source->first,true,true,false,(char *)0x0,-1,false,false);
          if ((PVar3 == WARN) &&
             ((sVar6 = (source->first)._M_string_length, sVar6 != dirs._M_string_length ||
              ((sVar6 != 0 &&
               (iVar4 = bcmp((source->first)._M_dataplus._M_p,dirs._M_dataplus._M_p,sVar6),
               iVar4 != 0)))))) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&w,"Evaluated link library\n",0x17);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&w,dirs._M_dataplus._M_p,dirs._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"as\n",3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(source->first)._M_dataplus._M_p,
                                (source->first)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirs._M_dataplus._M_p != &dirs.field_2) {
            operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
          }
        }
        source = source + 1;
      } while (source != (this->LinkLibraries).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::stringbuf::str();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs._M_dataplus._M_p != &dirs.field_2) {
      operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
    }
    if (dirs._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirs);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&orig,(cmPolicies *)0x13,id);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&dirs,orig._M_dataplus._M_p,orig._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"The following variable evaluations were encountered:\n",0x35);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_340,local_338);
      if (local_340 != local_330) {
        operator_delete(local_340,local_330[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)orig._M_dataplus._M_p != &orig.field_2) {
        operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&orig,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)orig._M_dataplus._M_p != &orig.field_2) {
        operator_delete(orig._M_dataplus._M_p,orig.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirs);
      std::ios_base::~ios_base(local_2b0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
    std::ios_base::~ios_base(local_138);
    return;
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if(pol != cmPolicies::OLD && pol != cmPolicies::WARN)
    {
    return;
    }
  std::ostringstream w;

  const char *includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if(mightExpandVariablesCMP0019(includeDirs))
    {
    std::string dirs = includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if(pol == cmPolicies::WARN && dirs != includeDirs)
      {
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
    }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (cmTargets::iterator l = this->Targets.begin();
       l != this->Targets.end(); ++l)
    {
    cmTarget &t = l->second;
    if (t.GetType() == cmState::INTERFACE_LIBRARY
        || t.GetType() == cmState::GLOBAL_TARGET)
      {
      continue;
      }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if(mightExpandVariablesCMP0019(includeDirs))
      {
      std::string dirs = includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if(pol == cmPolicies::WARN && dirs != includeDirs)
        {
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
      }
    }

  if (const char* linkDirsProp = this->GetProperty("LINK_DIRECTORIES"))
    {
    if(mightExpandVariablesCMP0019(linkDirsProp))
      {
      std::string d = linkDirsProp;
      std::string orig = linkDirsProp;
      this->ExpandVariablesInString(d, true, true);
      if(pol == cmPolicies::WARN && d != orig)
        {
        w << "Evaluated link directories\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << d << "\n";
        }
      }
    }
  for(cmTarget::LinkLibraryVectorType::iterator l =
        this->LinkLibraries.begin();
      l != this->LinkLibraries.end(); ++l)
    {
    if(mightExpandVariablesCMP0019(l->first.c_str()))
      {
      std::string orig = l->first;
      this->ExpandVariablesInString(l->first, true, true);
      if(pol == cmPolicies::WARN && l->first != orig)
        {
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << l->first << "\n";
        }
      }
    }

  if(!w.str().empty())
    {
    std::ostringstream m;
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    this->IssueMessage(cmake::AUTHOR_WARNING, m.str());
    }
}